

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PerPatchDataCase::init
          (PerPatchDataCase *this,EVP_PKEY_CTX *ctx)

{
  CaseType CVar1;
  Context *this_00;
  RenderContext *renderCtx;
  bool bVar2;
  bool bVar3;
  int iVar4;
  RenderTarget *renderTarget;
  ShaderProgram *this_01;
  ProgramSources *pPVar5;
  TestError *this_02;
  char *pcVar6;
  uint *code;
  TessPrimitiveType primType;
  bool *pbVar7;
  undefined4 uVar8;
  char *pcVar9;
  allocator<char> local_319;
  CaseType local_318;
  undefined4 local_314;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [40];
  undefined1 local_288 [40];
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  SharedPtr<const_glu::ShaderProgram> local_210;
  string fragmentShaderTemplate;
  string outSizeStr;
  string local_1c0;
  string local_1a0;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string inSizeStr;
  ProgramSources local_100;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  de::toString<int>(&inSizeStr,&(anonymous_namespace)::PerPatchDataCase::INPUT_PATCH_SIZE);
  de::toString<int>(&outSizeStr,&(anonymous_namespace)::PerPatchDataCase::OUTPUT_PATCH_SIZE);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,(allocator<char> *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &outSizeStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 ") out;\n\nin highp float in_tc_attr[];\n\nout highp float in_te_attr[];\n");
  pcVar6 = "patch out mediump int in_te_patchVerticesInFromTCS;\n";
  pcVar9 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (this->m_caseType != CASETYPE_PATCH_VERTICES_IN_TCS) {
    pcVar6 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  pbVar7 = (bool *)"patch out mediump int in_te_primitiveIDFromTCS;\n";
  if (this->m_caseType != CASETYPE_PRIMITIVE_ID_TCS) {
    pbVar7 = (bool *)pcVar6;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 pbVar7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 "\nvoid main (void)\n{\n\tin_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
                );
  pcVar6 = "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n";
  if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS) {
    pcVar9 = "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n";
  }
  pbVar7 = (bool *)"\tin_te_primitiveIDFromTCS = gl_PrimitiveID;\n";
  if (this->m_caseType != CASETYPE_PRIMITIVE_ID_TCS) {
    pbVar7 = (bool *)pcVar9;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 pbVar7);
  std::operator+(&tessellationControlTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "\n\tgl_TessLevelInner[0] = 9.0;\n\tgl_TessLevelInner[1] = 8.0;\n\n\tgl_TessLevelOuter[0] = 7.0;\n\tgl_TessLevelOuter[1] = 6.0;\n\tgl_TessLevelOuter[2] = 5.0;\n\tgl_TessLevelOuter[3] = 4.0;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_2b0);
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&fragmentShaderTemplate,(_anonymous_namespace_ *)0x1,primType,SUB81(pcVar6,0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",&fragmentShaderTemplate)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 "\nin highp float in_te_attr[];\n");
  CVar1 = this->m_caseType;
  if (CVar1 == CASETYPE_PRIMITIVE_ID_TCS) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"patch in mediump int in_te_primitiveIDFromTCS;\n",&local_319);
LAB_0040bba4:
    uVar8 = 0;
  }
  else {
    if (CVar1 != CASETYPE_PATCH_VERTICES_IN_TCS) {
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      local_2d0._M_string_length = 0;
      local_2d0.field_2._M_local_buf[0] = '\0';
      goto LAB_0040bba4;
    }
    uVar8 = (undefined4)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"patch in mediump int in_te_patchVerticesInFromTCS;\n",
               &local_319);
  }
  local_318 = CVar1;
  local_314 = uVar8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 &local_2d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 "\nout mediump vec4 in_f_color;\n\nuniform highp float u_xScale;\n\nvoid main (void)\n{\n\thighp float x = (gl_TessCoord.x*u_xScale + in_te_attr[0]) * 2.0 - 1.0;\n\thighp float y = gl_TessCoord.y*2.0 - 1.0;\n\tgl_Position = vec4(x, y, 0.0, 1.0);\n"
                );
  CVar1 = this->m_caseType;
  if (CVar1 == CASETYPE_PRIMITIVE_ID_TCS) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"\tbool ok = in_te_primitiveIDFromTCS == 3;\n",
               (allocator<char> *)&local_2f0);
    code = (uint *)pcVar6;
LAB_0040bc40:
    bVar3 = false;
LAB_0040bc43:
    bVar2 = false;
  }
  else {
    code = &switchD_0040bc0a::switchdataD_007fcd8c;
    switch(CVar1) {
    case CASETYPE_PRIMITIVE_ID_TES:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"\tbool ok = gl_PrimitiveID == 3;\n",
                 (allocator<char> *)&local_2f0);
      goto LAB_0040bc40;
    case CASETYPE_PATCH_VERTICES_IN_TCS:
      std::operator+(&local_2f0,"\tbool ok = in_te_patchVerticesInFromTCS == ",&inSizeStr);
      std::operator+(&local_310,&local_2f0,";\n");
      bVar3 = true;
      goto LAB_0040bc43;
    case CASETYPE_PATCH_VERTICES_IN_TES:
      std::operator+(&local_2f0,"\tbool ok = gl_PatchVerticesIn == ",&outSizeStr);
      std::operator+(&local_310,&local_2f0,";\n");
      bVar2 = true;
      bVar3 = false;
      goto LAB_0040bd1d;
    case CASETYPE_TESS_LEVEL_INNER0_TES:
      pcVar9 = "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n";
      break;
    case CASETYPE_TESS_LEVEL_INNER1_TES:
      pcVar9 = "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n";
      break;
    case CASETYPE_TESS_LEVEL_OUTER0_TES:
      pcVar9 = "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n";
      break;
    case CASETYPE_TESS_LEVEL_OUTER1_TES:
      pcVar9 = "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n";
      break;
    case CASETYPE_TESS_LEVEL_OUTER2_TES:
      pcVar9 = "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n";
      break;
    default:
      pcVar9 = (char *)0x0;
      code = (uint *)pcVar6;
      if (CVar1 == CASETYPE_TESS_LEVEL_OUTER3_TES) {
        pcVar9 = "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n";
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,pcVar9,(allocator<char> *)&local_2f0);
    bVar3 = false;
    bVar2 = false;
  }
LAB_0040bd1d:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 &local_310);
  std::operator+(&tessellationEvaluationTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "\tin_f_color = ok ? vec4(1.0) : vec4(vec3(0.0), 1.0);\n}\n");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_310);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  if (bVar3) {
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,(allocator<char> *)&local_100);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2d0,(_anonymous_namespace_ *)this_00,
             (Context *)vertexShaderTemplate._M_dataplus._M_p,(char *)code);
  glu::VertexSource::VertexSource((VertexSource *)local_238,&local_2d0);
  pPVar5 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_238);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_310,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationControlTemplate._M_dataplus._M_p,(char *)code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_260,&local_310);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_260);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,(char *)code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_288,&local_1a0);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_288);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragmentShaderTemplate._M_dataplus._M_p,(char *)code);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2b0,&local_1c0);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_2b0);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar5);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_210,this_01);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_210);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_210);
  std::__cxx11::string::~string((string *)(local_2b0 + 8));
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_2d0);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk == false) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0xcb2);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
  std::__cxx11::string::~string((string *)&tessellationControlTemplate);
  std::__cxx11::string::~string((string *)&vertexShaderTemplate);
  std::__cxx11::string::~string((string *)&outSizeStr);
  iVar4 = std::__cxx11::string::~string((string *)&inSizeStr);
  return iVar4;
}

Assistant:

void PerPatchDataCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	DE_ASSERT(OUTPUT_PATCH_SIZE < INPUT_PATCH_SIZE);

	const string inSizeStr		= de::toString(INPUT_PATCH_SIZE);
	const string outSizeStr		= de::toString(OUTPUT_PATCH_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + outSizeStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch out mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch out mediump int in_te_patchVerticesInFromTCS;\n"
													  : "") +
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tin_te_primitiveIDFromTCS = gl_PrimitiveID;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n"
													  : "") +
													 "\n"
													 "	gl_TessLevelInner[0] = 9.0;\n"
													 "	gl_TessLevelInner[1] = 8.0;\n"
													 "\n"
													"	gl_TessLevelOuter[0] = 7.0;\n"
													"	gl_TessLevelOuter[1] = 6.0;\n"
													"	gl_TessLevelOuter[2] = 5.0;\n"
													"	gl_TessLevelOuter[3] = 4.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch in mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch in mediump int in_te_patchVerticesInFromTCS;\n"
													  : string()) +
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "uniform highp float u_xScale;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = (gl_TessCoord.x*u_xScale + in_te_attr[0]) * 2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y*2.0 - 1.0;\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tbool ok = in_te_primitiveIDFromTCS == 3;\n"
													  : m_caseType == CASETYPE_PRIMITIVE_ID_TES			? "\tbool ok = gl_PrimitiveID == 3;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tbool ok = in_te_patchVerticesInFromTCS == " + inSizeStr + ";\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TES	? "\tbool ok = gl_PatchVerticesIn == " + outSizeStr + ";\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER0_TES	? "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER1_TES	? "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER0_TES	? "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER1_TES	? "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER2_TES	? "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER3_TES	? "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n"
													  : DE_NULL) +
													  "	in_f_color = ok ? vec4(1.0) : vec4(vec3(0.0), 1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}